

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManPartitionSmartRegisters(Aig_Man_t *pAig,int nSuppSizeLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar5;
  abctime aVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *vPartsAll_00;
  Vec_Ptr_t *vPartSuppsAll_00;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  uint *puVar10;
  void *pvVar11;
  abctime clk;
  int iOut;
  int iPart;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vPart;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vPartSuppsAll;
  Vec_Ptr_t *vPartsAll2;
  Vec_Ptr_t *vPartsAll;
  Vec_Ptr_t *vSupports;
  Vec_Ptr_t *vPartSuppsBit;
  int fVerbose_local;
  int nSuppSizeLimit_local;
  Aig_Man_t *pAig_local;
  
  aVar4 = Abc_Clock();
  p = Aig_ManSupportsRegisters(pAig);
  iVar1 = Vec_PtrSize(p);
  iVar2 = Aig_ManRegNum(pAig);
  if (iVar1 == iVar2) {
    for (iOut = 0; iVar1 = Vec_PtrSize(p), iOut < iVar1; iOut = iOut + 1) {
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p,iOut);
      Vec_IntPush(pVVar5,iOut);
    }
    if (fVerbose != 0) {
      Abc_Print(1,"%s =","Supps");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    pVVar7 = Vec_PtrAlloc(1000);
    aVar4 = Abc_Clock();
    vPartsAll_00 = Vec_PtrAlloc(0x100);
    vPartSuppsAll_00 = Vec_PtrAlloc(0x100);
    for (iOut = 0; iVar1 = Vec_PtrSize(p), iOut < iVar1; iOut = iOut + 1) {
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p,iOut);
      iVar1 = Vec_IntPop(pVVar5);
      iVar2 = Aig_ManPartitionSmartFindPart
                        (vPartSuppsAll_00,vPartsAll_00,pVVar7,nSuppSizeLimit,pVVar5);
      if (iVar2 == -1) {
        pVVar8 = Vec_IntAlloc(0x20);
        Vec_IntPush(pVVar8,iVar1);
        pVVar9 = Vec_IntDup(pVVar5);
        Vec_PtrPush(vPartsAll_00,pVVar8);
        Vec_PtrPush(vPartSuppsAll_00,pVVar9);
        iVar1 = Vec_PtrSize(p);
        puVar10 = Aig_ManSuppCharStart(pVVar5,iVar1);
        Vec_PtrPush(pVVar7,puVar10);
      }
      else {
        pVVar8 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll_00,iVar2);
        Vec_IntPush(pVVar8,iVar1);
        pVVar8 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iVar2);
        pVVar9 = Vec_IntTwoMerge(pVVar8,pVVar5);
        Vec_IntFree(pVVar8);
        Vec_PtrWriteEntry(vPartSuppsAll_00,iVar2,pVVar9);
        puVar10 = (uint *)Vec_PtrEntry(pVVar7,iVar2);
        iVar1 = Vec_PtrSize(p);
        Aig_ManSuppCharAdd(puVar10,pVVar5,iVar1);
      }
    }
    for (iOut = 0; iVar1 = Vec_PtrSize(pVVar7), iOut < iVar1; iOut = iOut + 1) {
      pvVar11 = Vec_PtrEntry(pVVar7,iOut);
      if (pvVar11 != (void *)0x0) {
        free(pvVar11);
      }
    }
    Vec_PtrFree(pVVar7);
    if (fVerbose != 0) {
      Abc_Print(1,"%s =","Parts");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    Abc_Clock();
    for (iOut = 0; iVar1 = Vec_PtrSize(vPartSuppsAll_00), iOut < iVar1; iOut = iOut + 1) {
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iOut);
      Vec_IntPush(pVVar5,iOut);
    }
    Vec_VecSort((Vec_Vec_t *)vPartSuppsAll_00,1);
    pVVar7 = Vec_PtrAlloc(0x100);
    for (iOut = 0; iVar1 = Vec_PtrSize(vPartSuppsAll_00), iOut < iVar1; iOut = iOut + 1) {
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iOut);
      iVar1 = Vec_IntPop(pVVar5);
      pvVar11 = Vec_PtrEntry(vPartsAll_00,iVar1);
      Vec_PtrPush(pVVar7,pvVar11);
    }
    Vec_PtrFree(vPartsAll_00);
    Aig_ManPartitionCompact(pVVar7,vPartSuppsAll_00,nSuppSizeLimit);
    if (fVerbose != 0) {
      uVar3 = Vec_PtrSize(pVVar7);
      printf("Created %d partitions.\n",(ulong)uVar3);
    }
    Vec_VecFree((Vec_Vec_t *)p);
    Vec_VecFree((Vec_Vec_t *)vPartSuppsAll_00);
    return pVVar7;
  }
  __assert_fail("Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                ,0x336,"Vec_Ptr_t *Aig_ManPartitionSmartRegisters(Aig_Man_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmartRegisters( Aig_Man_t * pAig, int nSuppSizeLimit, int fVerbose )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // add output number to each
clk = Abc_Clock();
    vSupports = Aig_ManSupportsRegisters( pAig );
    assert( Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
        Vec_IntPush( vOne, i );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}

    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Vec_PtrSize(vSupports)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Vec_PtrSize(vSupports) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
//    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
//    else
//        *pvPartSupps = vPartSuppsAll;

/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}